

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall lexer::Lexer::Lexer(Lexer *this,LexerRules *lexerRules)

{
  byte bVar1;
  bool bVar2;
  size_type __new_size;
  pointer ppVar3;
  pointer ppVar4;
  reference pcVar5;
  reference this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  char *local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  char local_79;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_78;
  char c_1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  const_iterator c;
  _Self local_60;
  const_iterator transition;
  vector<lexer::Transition,_std::allocator<lexer::Transition>_> lexerState;
  _Self local_38;
  const_iterator rule;
  size_t maxChar;
  LexerRules *lexerRules_local;
  Lexer *this_local;
  
  std::
  vector<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
  ::vector(&this->lexerStateMachine);
  __new_size = std::
               map<int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>_>_>
               ::size(lexerRules);
  std::
  vector<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
  ::resize(&this->lexerStateMachine,__new_size);
  bVar1 = std::numeric_limits<unsigned_char>::max();
  rule._M_node = (_Base_ptr)(ulong)bVar1;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>_>_>
       ::begin(lexerRules);
  while( true ) {
    lexerState.super__Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>_>_>
                  ::end(lexerRules);
    bVar2 = std::operator!=(&local_38,
                            (_Self *)&lexerState.
                                      super__Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) break;
    std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>::vector
              ((vector<lexer::Transition,_std::allocator<lexer::Transition>_> *)&transition);
    std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>::resize
              ((vector<lexer::Transition,_std::allocator<lexer::Transition>_> *)&transition,
               (size_type)rule._M_node);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>_>
             ::operator->(&local_38);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>
         ::begin(&ppVar3->second);
    while( true ) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>_>
               ::operator->(&local_38);
      c._M_current = (char *)std::
                             map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>
                             ::end(&ppVar3->second);
      bVar2 = std::operator!=(&local_60,(_Self *)&c);
      if (!bVar2) break;
      ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_lexer::Condition,_lexer::Transition>_>::
               operator->(&local_60);
      if (((ppVar4->first).inSet & 1U) == 0) {
        for (local_79 = '\0'; (_Base_ptr)(long)local_79 < rule._M_node; local_79 = local_79 + '\x01'
            ) {
          std::_Rb_tree_const_iterator<std::pair<const_lexer::Condition,_lexer::Transition>_>::
          operator->(&local_60);
          local_90._M_current = (char *)std::__cxx11::string::begin();
          std::_Rb_tree_const_iterator<std::pair<const_lexer::Condition,_lexer::Transition>_>::
          operator->(&local_60);
          local_98 = (char *)std::__cxx11::string::end();
          local_88 = std::find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                               (local_90,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          )local_98,&local_79);
          std::_Rb_tree_const_iterator<std::pair<const_lexer::Condition,_lexer::Transition>_>::
          operator->(&local_60);
          local_a0._M_current = (char *)std::__cxx11::string::end();
          bVar2 = __gnu_cxx::operator==(&local_88,&local_a0);
          if (bVar2) {
            ppVar4 = std::
                     _Rb_tree_const_iterator<std::pair<const_lexer::Condition,_lexer::Transition>_>
                     ::operator->(&local_60);
            updateTransition(this,(vector<lexer::Transition,_std::allocator<lexer::Transition>_> *)
                                  &transition,&ppVar4->second,local_79);
          }
        }
      }
      else {
        std::_Rb_tree_const_iterator<std::pair<const_lexer::Condition,_lexer::Transition>_>::
        operator->(&local_60);
        local_70._M_current = (char *)std::__cxx11::string::begin();
        while( true ) {
          std::_Rb_tree_const_iterator<std::pair<const_lexer::Condition,_lexer::Transition>_>::
          operator->(&local_60);
          _Stack_78._M_current = (char *)std::__cxx11::string::end();
          bVar2 = __gnu_cxx::operator!=(&local_70,&stack0xffffffffffffff88);
          if (!bVar2) break;
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_lexer::Condition,_lexer::Transition>_>::
                   operator->(&local_60);
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_70);
          updateTransition(this,(vector<lexer::Transition,_std::allocator<lexer::Transition>_> *)
                                &transition,&ppVar4->second,*pcVar5);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_70);
        }
      }
      std::_Rb_tree_const_iterator<std::pair<const_lexer::Condition,_lexer::Transition>_>::
      operator++(&local_60);
    }
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>_>
             ::operator->(&local_38);
    this_00 = std::
              vector<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
              ::at(&this->lexerStateMachine,(long)ppVar3->first);
    std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>::operator=
              (this_00,(vector<lexer::Transition,_std::allocator<lexer::Transition>_> *)&transition)
    ;
    std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>::~vector
              ((vector<lexer::Transition,_std::allocator<lexer::Transition>_> *)&transition);
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

explicit Lexer(LexerRules const &lexerRules) {
            lexerStateMachine.resize(lexerRules.size());

            size_t maxChar = std::numeric_limits<uint8_t>::max();

            for_each_c (LexerRules, lexerRules, rule) {
                std::vector<Transition> lexerState;

                lexerState.resize(static_cast<size_t>(maxChar));

                for_each_c (LexerRule, rule->second, transition) {
                    if (transition->first.inSet)
                        for_each_c (std::string, transition->first.chars, c)
                            updateTransition(lexerState, transition->second, *c);
                    else
                        for (char c = 0; c < maxChar; ++c)
                            if (std::find(transition->first.chars.begin(),
                                          transition->first.chars.end(), c) == transition->first.chars.end())
                                updateTransition(lexerState, transition->second, c);
                }

                lexerStateMachine.at(static_cast<size_t>(rule->first)) = lexerState;
            }
        }